

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int subjRequiresPage(PgHdr *pPg)

{
  uint i_00;
  Pager *pPVar1;
  PagerSavepoint *pPVar2;
  int iVar3;
  PagerSavepoint *p;
  int i;
  Pager *pPager;
  Pgno pgno;
  PgHdr *pPg_local;
  
  i_00 = pPg->pgno;
  pPVar1 = pPg->pPager;
  p._4_4_ = 0;
  while( true ) {
    if (pPVar1->nSavepoint <= p._4_4_) {
      return 0;
    }
    pPVar2 = pPVar1->aSavepoint;
    if ((i_00 <= pPVar2[p._4_4_].nOrig) &&
       (iVar3 = sqlite3BitvecTest(pPVar2[p._4_4_].pInSavepoint,i_00), iVar3 == 0)) break;
    p._4_4_ = p._4_4_ + 1;
  }
  return 1;
}

Assistant:

static int subjRequiresPage(PgHdr *pPg){
  Pgno pgno = pPg->pgno;
  Pager *pPager = pPg->pPager;
  int i;
  for(i=0; i<pPager->nSavepoint; i++){
    PagerSavepoint *p = &pPager->aSavepoint[i];
    if( p->nOrig>=pgno && 0==sqlite3BitvecTest(p->pInSavepoint, pgno) ){
      return 1;
    }
  }
  return 0;
}